

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

bool __thiscall
crnlib::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  bool bVar1;
  uint uVar2;
  decoder_tables *pdVar3;
  uint *in_RDI;
  uint total_syms;
  uint in_stack_0000010c;
  decoder_tables *in_stack_00000110;
  uint8 *in_stack_00000118;
  uint in_stack_00000120;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 6));
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *in_RDI = uVar2;
  vector<unsigned_short>::clear
            ((vector<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
            );
  if (*(long *)(in_RDI + 10) == 0) {
    pdVar3 = crnlib_new<crnlib::prefix_coding::decoder_tables>();
    *(decoder_tables **)(in_RDI + 10) = pdVar3;
  }
  uVar2 = *in_RDI;
  vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 6),0);
  compute_decoder_table_bits((static_huffman_data_model *)CONCAT44(uVar2,in_stack_ffffffffffffffd0))
  ;
  bVar1 = prefix_coding::generate_decoder_tables
                    (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_0000010c);
  return bVar1;
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables() {
  uint total_syms = m_code_sizes.size();

  CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

  m_encoding = false;

  m_total_syms = total_syms;

  m_codes.clear();

  if (!m_pDecode_tables)
    m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();

  return prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits());
}